

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.hpp
# Opt level: O0

string * __thiscall
gzip::compress_abi_cxx11_
          (string *__return_storage_ptr__,gzip *this,char *data,size_t size,int level)

{
  undefined1 local_38 [8];
  Compressor comp;
  int level_local;
  size_t size_local;
  char *data_local;
  string *output;
  
  comp._12_4_ = SUB84(size,0);
  Compressor::Compressor((Compressor *)local_38,comp._12_4_,2000000000);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Compressor::compress<std::__cxx11::string>
            ((Compressor *)local_38,__return_storage_ptr__,(char *)this,(size_t)data);
  return __return_storage_ptr__;
}

Assistant:

inline std::string compress(const char *data,
                                std::size_t size,
                                int level = Z_DEFAULT_COMPRESSION) {
        Compressor comp(level);
        std::string output;
        comp.compress(output, data, size);
        return output;
    }